

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_lookup.cpp
# Opt level: O1

void __thiscall ON_SerialNumberMap::Internal_HashTableInitialize(ON_SerialNumberMap *this)

{
  ON__UINT64 OVar1;
  ulong uVar2;
  long lVar3;
  
  if (this->m_bHashTableIsValid == '\0') {
    if (this->m_hash_block_count != 0) {
      if (this->m_hash_block_count != 0) {
        uVar2 = 0;
        do {
          memset(this->m_hash_table_blocks[uVar2],0,0x7fd0);
          uVar2 = uVar2 + 1;
        } while (uVar2 < this->m_hash_block_count);
      }
      this->m_bHashTableIsValid = '\x01';
      if (this->m_snblk_list_count == 0) {
        lVar3 = 0;
      }
      else {
        uVar2 = 0;
        lVar3 = 0;
        do {
          OVar1 = Internal_HashTableAddSerialNumberBlock(this,this->m_snblk_list[uVar2]);
          lVar3 = lVar3 + OVar1;
          uVar2 = uVar2 + 1;
        } while (uVar2 < this->m_snblk_list_count);
      }
      OVar1 = Internal_HashTableAddSerialNumberBlock(this,this->m_sn_block0);
      if (OVar1 + lVar3 != this->m_active_id_count) {
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_lookup.cpp"
                   ,0x7f4,"","m_active_id_count was corrupt and had to be fixed.");
        this->m_active_id_count = OVar1 + lVar3;
      }
    }
    return;
  }
  return;
}

Assistant:

void ON_SerialNumberMap::Internal_HashTableInitialize() const
{
  // This function is called when code requires
  // m_hash_table[] to be valid so an id can be looked up.
  if (false == m_bHashTableIsValid && m_hash_block_count > 0)
  {
    for (ON__UINT32 i = 0; i < m_hash_block_count; i++)
      memset(m_hash_table_blocks[i], 0, ON_SN_BLOCK::ID_HASH_BLOCK_CAPACITY*sizeof(m_hash_table_blocks[0][0]));

    // m_bHashTableIsValid must be true
    // before calling Internal_HashTableAddSerialNumberBlock()
    m_bHashTableIsValid = true;

    ON__UINT64 active_id_count = 0;
    for (ON__UINT64 snblk_i = 0; snblk_i < m_snblk_list_count; snblk_i++)
      active_id_count += Internal_HashTableAddSerialNumberBlock(m_snblk_list[snblk_i]);

    // Add most recent entries last so they appear at the beginning of the 
    // hash table linked lists.
    active_id_count += Internal_HashTableAddSerialNumberBlock(const_cast<ON_SN_BLOCK*>(&m_sn_block0));

    if (active_id_count != m_active_id_count)
    {
      ON_ERROR("m_active_id_count was corrupt and had to be fixed.");
      const_cast<ON_SerialNumberMap*>(this)->m_active_id_count = active_id_count;
    }

  }
}